

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2b-ref.c
# Opt level: O0

int blake2b_init_param(blake2b_state *S,blake2b_param *P)

{
  uint64_t uVar1;
  byte *in_RSI;
  long in_RDI;
  size_t i;
  uint8_t *p;
  ulong uVar2;
  
  blake2b_init0((blake2b_state *)&DAT_aaaaaaaaaaaaaaaa);
  for (uVar2 = 0; uVar2 < 8; uVar2 = uVar2 + 1) {
    uVar1 = load64(in_RSI + uVar2 * 8);
    *(uint64_t *)(in_RDI + uVar2 * 8) = uVar1 ^ *(ulong *)(in_RDI + uVar2 * 8);
  }
  *(ulong *)(in_RDI + 0xe8) = (ulong)*in_RSI;
  return 0;
}

Assistant:

int blake2b_init_param( blake2b_state *S, const blake2b_param *P )
{
  const uint8_t *p = ( const uint8_t * )( P );
  size_t i;

  blake2b_init0( S );

  /* IV XOR ParamBlock */
  for( i = 0; i < 8; ++i )
    S->h[i] ^= load64( p + sizeof( S->h[i] ) * i );

  S->outlen = P->digest_length;
  return 0;
}